

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

float Abc_BufComputeArr(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  
  uVar1 = (pObj->vFanins).nSize;
  if ((int)uVar1 < 1) {
    fVar6 = -1e+09;
  }
  else {
    iVar2 = pObj->Id;
    if (((long)iVar2 < 0) || (p->vOffsets->nSize <= iVar2)) {
LAB_00453521:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar2 = p->vOffsets->pArray[iVar2];
    lVar4 = (long)iVar2;
    fVar6 = -1e+09;
    uVar5 = 0;
    do {
      if (iVar2 != -1000000000) {
        iVar3 = *(int *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[uVar5]] + 0x10);
        if (((((long)iVar3 < 0) || (p->vArr->nSize <= iVar3)) || (lVar4 < 0)) ||
           (p->vEdges->nSize <= lVar4)) goto LAB_00453521;
        fVar7 = (float)(p->vArr->pArray[iVar3] + p->vEdges->pArray[lVar4]);
        if (fVar6 < fVar7) {
          fVar6 = fVar7;
        }
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 1;
    } while (uVar1 != uVar5);
  }
  iVar2 = pObj->Id;
  if ((-1 < (long)iVar2) && (iVar2 < p->vArr->nSize)) {
    p->vArr->pArray[iVar2] = (int)fVar6;
    return fVar6;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

float Abc_BufComputeArr( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    float DelayF, Delay = -ABC_INFINITY;
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        if ( Vec_IntEntry(p->vOffsets, Abc_ObjId(pObj)) == -ABC_INFINITY )
            continue;
        DelayF = Abc_BufNodeArr(p, pFanin) + Abc_BufEdgeDelay(p, pObj, i);
        if ( Delay < DelayF )
            Delay = DelayF;
    }
    Abc_BufSetNodeArr( p, pObj, Delay );
    return Delay;
}